

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

int __thiscall Fl_Help_View::get_length(Fl_Help_View *this,char *l)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  if (*l == '\0') {
    iVar1 = 0;
  }
  else {
    iVar1 = atoi(l);
    sVar3 = strlen(l);
    if (l[sVar3 - 1] == '%') {
      iVar2 = 0;
      if (0 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = 100;
      if (iVar2 < 100) {
        iVar1 = iVar2;
      }
      iVar2 = this->scrollbar_size_;
      if (iVar2 == 0) {
        iVar2 = Fl::scrollbar_size();
      }
      iVar1 = ((this->hsize_ - iVar2) * iVar1) / 100;
    }
  }
  return iVar1;
}

Assistant:

int
Fl_Help_View::get_length(const char *l) {	// I - Value
  int	val;					// Integer value

  if (!l[0]) return 0;

  val = atoi(l);
  if (l[strlen(l) - 1] == '%') {
    if (val > 100) val = 100;
    else if (val < 0) val = 0;

    int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    val = val * (hsize_ - scrollsize) / 100;
  }

  return val;
}